

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_object.cxx
# Opt level: O2

void __thiscall xray_re::xr_object::load_bones(xr_object *this,xr_reader *r)

{
  uint *puVar1;
  f_r_new<xray_re::xr_bone> read;
  offset_in_xr_bone_to_subr in_RAX;
  size_t sVar2;
  undefined8 unaff_RBX;
  undefined1 in_stack_00000008 [16];
  
  read._8_8_ = unaff_RBX;
  read.pmf = in_RAX;
  xr_reader::
  r_chunks<std::vector<xray_re::xr_bone*,std::allocator<xray_re::xr_bone*>>,xray_re::xr_reader::f_r_new<xray_re::xr_bone>>
            (r,&this->m_bones,read);
  sVar2 = xr_reader::find_chunk(r,0x923);
  if (sVar2 != 0) {
    puVar1 = (r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
    xr_reader::
    r_seq<std::vector<xray_re::xr_partition*,std::allocator<xray_re::xr_partition*>>,xray_re::xr_reader::f_r_new<xray_re::xr_partition>>
              (r,(ulong)*puVar1,&this->m_partitions,
               (f_r_new<xray_re::xr_partition>)in_stack_00000008);
    return;
  }
  return;
}

Assistant:

void xr_object::load_bones(xr_reader& r)
{
	r.r_chunks(m_bones, xr_reader::f_r_new<xr_bone>(&xr_bone::load_data));
	if (r.find_chunk(EOBJ_CHUNK_PARTITIONS_1)) {
		r.r_seq(r.r_u32(), m_partitions, xr_reader::f_r_new<xr_partition>(&xr_partition::load_1));
		r.debug_find_chunk();
	}
}